

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O2

csv<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
argagg::convert::
converter<argagg::csv<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::convert(csv<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *__return_storage_ptr__,char *s)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  char *s_local;
  
  (__return_storage_ptr__->values).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  (__return_storage_ptr__->values).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  value.field_2._M_local_buf[0] = '\0';
  s_local = s;
  while( true ) {
    bVar1 = parse_next_component<std::__cxx11::string>(&s_local,&value,',');
    if (!bVar1) break;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&value);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&value);
  std::__cxx11::string::~string((string *)&value);
  return __return_storage_ptr__;
}

Assistant:

csv<T>
converter<csv<T>>::convert(const char* s)
{
  csv<T> result {{}};
  T value;
  while (parse_next_component(s, value, ',')) {
    result.values.emplace_back(std::move(value));
  }
  result.values.emplace_back(std::move(value));
  return result;
}